

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vendor.cpp
# Opt level: O1

int pay(int choice,int num,double income)

{
  char cVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  long *plVar6;
  ostream *poVar7;
  double *extraout_RDX;
  double *income_00;
  ulong uVar8;
  int iVar9;
  double extraout_XMM0_Qa;
  double input;
  double local_60;
  double local_58;
  int local_4c;
  double local_48;
  int *local_40;
  double local_38;
  
  lVar5 = (long)choice;
  uVar8 = lVar5 * 0x38;
  local_60 = (double)num * ITEM[lVar5].price;
  local_48 = 0.0;
  local_58 = income;
  local_4c = num;
  if (isVIP) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Since you are our VIP, you got 25% off!",0x27);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
    std::ostream::put('0');
    std::ostream::flush();
    local_60 = local_60 * 0.75;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "-------------------------------------------------------------------------",0x49);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
  std::ostream::put('0');
  plVar6 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
  std::ostream::put((char)plVar6);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Please pay ",0xb);
  poVar7 = std::ostream::_M_insert<double>(local_60);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," yuan",5);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "-------------------------------------------------------------------------",0x49);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
  std::ostream::put('0');
  plVar6 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
  std::ostream::put((char)plVar6);
  std::ostream::flush();
  local_40 = &ITEM[lVar5].amount;
  iVar4 = 1;
  do {
    iVar9 = iVar4;
    iVar3 = 0x1091a8;
    income_00 = &local_48;
    std::istream::_M_extract<double>((double *)&std::cin);
    local_58 = local_48 + local_58;
    if ((local_58 <= local_60) || (balance < local_58 - local_60)) {
      if (local_58 - local_60 <= balance) {
        if ((local_58 != local_60) || (NAN(local_58) || NAN(local_60))) {
          if (local_58 < local_60) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,
                       "Sorry! The money you paid is not enough! Please pay more!",0x39);
            cVar1 = std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
            income_00 = (double *)(ulong)(uint)(int)cVar1;
            iVar3 = std::ostream::put('0');
            std::ostream::flush();
            iVar9 = -1;
          }
          goto LAB_0010415a;
        }
        local_38 = local_58;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "-------------------------------------------------------------------------",0x49)
        ;
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
        std::ostream::put('0');
        plVar6 = (long *)std::ostream::flush();
        std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
        std::ostream::put((char)plVar6);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Payment is successful! Thank you!",0x21);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
        std::ostream::put('0');
        std::ostream::flush();
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
        std::ostream::put('0');
        plVar6 = (long *)std::ostream::flush();
        std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
        std::ostream::put((char)plVar6);
        poVar7 = (ostream *)std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"back",4);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
        std::ostream::put((char)poVar7);
        std::ostream::flush();
        balance = local_38 + balance;
        uVar8 = 0;
        local_58 = 0.0;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "-------------------------------------------------------------------------",0x49)
        ;
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
        std::ostream::put('0');
        plVar6 = (long *)std::ostream::flush();
        cVar1 = std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
        income_00 = (double *)(ulong)(uint)(int)cVar1;
        iVar3 = std::ostream::put((char)plVar6);
        std::ostream::flush();
        buttonback();
        balance = balance + 0.0;
        local_58 = 0.0;
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "-------------------------------------------------------------------------",0x49)
        ;
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
        std::ostream::put('0');
        plVar6 = (long *)std::ostream::flush();
        std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
        std::ostream::put((char)plVar6);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Sorry, there\'s not enough balance in the machine!",0x31);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
        std::ostream::put('0');
        poVar7 = (ostream *)std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"Refunding...Please wait...",0x1a)
        ;
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
        std::ostream::put((char)poVar7);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "-------------------------------------------------------------------------",0x49)
        ;
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
        std::ostream::put('0');
        plVar6 = (long *)std::ostream::flush();
        std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
        std::ostream::put((char)plVar6);
        std::ostream::flush();
        income_00 = &local_58;
        deal(-1,income_00,&balance,local_60);
        iVar3 = -1;
        uVar2 = deal(-1,income_00,&balance,local_60);
        uVar8 = (ulong)uVar2;
      }
      iVar9 = 0;
    }
    else {
      iVar9 = 0;
      uVar2 = deal(0,&local_58,&balance,local_60);
      uVar8 = (ulong)uVar2;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "-------------------------------------------------------------------------",0x49);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
      std::ostream::put('0');
      plVar6 = (long *)std::ostream::flush();
      std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
      std::ostream::put((char)plVar6);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Payment is successful! Thank you!",0x21);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
      std::ostream::put('0');
      plVar6 = (long *)std::ostream::flush();
      std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
      std::ostream::put((char)plVar6);
      plVar6 = (long *)std::ostream::flush();
      std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
      std::ostream::put((char)plVar6);
      poVar7 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"back",4);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Delivering,please wait.",0x17);
      *local_40 = *local_40 - local_4c;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "-------------------------------------------------------------------------",0x49);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
      std::ostream::put('0');
      plVar6 = (long *)std::ostream::flush();
      cVar1 = std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
      income_00 = (double *)(ulong)(uint)(int)cVar1;
      iVar3 = std::ostream::put((char)plVar6);
      std::ostream::flush();
      buttonback();
    }
LAB_0010415a:
    iVar4 = -1;
    if (iVar9 != -1) {
      if ((int)uVar8 != iVar9) {
        pay();
        if (iVar3 == -1) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,
                     "-------------------------------------------------------------------------",
                     0x49);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
          std::ostream::put('0');
          plVar6 = (long *)std::ostream::flush();
          std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
          std::ostream::put((char)plVar6);
          std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Here is the refund:",0x13);
          poVar7 = std::ostream::_M_insert<double>(*income_00);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"yuan.",5);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
          std::ostream::put((char)poVar7);
          std::ostream::flush();
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
          std::ostream::put('0');
          plVar6 = (long *)std::ostream::flush();
          std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
          std::ostream::put((char)plVar6);
          poVar7 = (ostream *)std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"back",4);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
          std::ostream::put((char)poVar7);
          std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,
                     "-------------------------------------------------------------------------",
                     0x49);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
          std::ostream::put('0');
          plVar6 = (long *)std::ostream::flush();
          std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
          std::ostream::put((char)plVar6);
          std::ostream::flush();
          *income_00 = 0.0;
          buttonback();
          iVar4 = -1;
        }
        else {
          if (iVar3 == 0) {
            *extraout_RDX = *extraout_RDX - (*income_00 - extraout_XMM0_Qa);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,
                       "-------------------------------------------------------------------------",
                       0x49);
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
            std::ostream::put('0');
            plVar6 = (long *)std::ostream::flush();
            std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
            std::ostream::put((char)plVar6);
            std::ostream::flush();
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"Here is the charge: ",0x14);
            poVar7 = std::ostream::_M_insert<double>(*income_00 - extraout_XMM0_Qa);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7," yuan.",6);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
            std::ostream::put((char)poVar7);
            std::ostream::flush();
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"Payment is successful! Thank you!",0x21);
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
            std::ostream::put('0');
            std::ostream::flush();
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
            std::ostream::put('0');
            plVar6 = (long *)std::ostream::flush();
            std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
            std::ostream::put((char)plVar6);
            poVar7 = (ostream *)std::ostream::flush();
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"back",4);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
            std::ostream::put((char)poVar7);
            std::ostream::flush();
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,
                       "-------------------------------------------------------------------------",
                       0x49);
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
            std::ostream::put('0');
            plVar6 = (long *)std::ostream::flush();
            std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
            std::ostream::put((char)plVar6);
            std::ostream::flush();
            *extraout_RDX = *extraout_RDX + *income_00;
            *income_00 = 0.0;
            buttonback();
          }
          else {
            *extraout_RDX = *extraout_RDX + *income_00;
            *income_00 = 0.0;
          }
          iVar4 = 0;
        }
        return iVar4;
      }
      return iVar9;
    }
  } while( true );
}

Assistant:

int pay(int choice, int num, double income) { //�����ɹ�����0�����󷵻�-1
    double pr = ITEM[choice].price * num, input = 0;
    if (isVIP) {
        cout << "Since you are our VIP, you got 25% off!" << endl;
        pr *= 3.0 / 4;
    }
    int signal, detection, isok = 1;
    frame
    cout << "Please pay " << pr << " yuan" << endl;
    frame
    do {
        cin >> input;
        income += input;
        if (income > pr && income - pr <= balance) {
            signal = 0;
            detection = deal(signal, income, balance, pr);
            frame
            cout << "Payment is successful! Thank you!" << endl << endl << endl << "back" << endl;
            deliver(signal, choice, num);
            isok = 0;
            frame
            buttonback();

        } else if (income - pr > balance) {
            frame
            cout << "Sorry, there's not enough balance in the machine!" << endl << "Refunding...Please wait..." << endl;
            frame
            signal = -1;
            deal(signal, income, balance, pr);
            detection = deal(signal, income, balance, pr);
            isok = 0;
        } else if (income == pr) {
            frame
            cout << "Payment is successful! Thank you!" << endl;
            cout << endl << endl << "back" << endl;
            signal = 1;
            deal(signal, income, balance, pr);
            frame
            buttonback();
            detection = deal(signal, income, balance, pr);
            isok = 0;
        } else if (income < pr) {
            cout << "Sorry! The money you paid is not enough! Please pay more!" << endl;
            isok = -1;
            /*int button = 1;
          if (button == 2) {
                signal = -1;
                detection = deal(signal, income, balance, pr);
                break;
            }*/
        }
    } while (isok == -1);
    if (detection == isok) {
        return isok;
    } else {
        detect(999);
    }
}